

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  int *piVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  pointer piVar4;
  iterator __position;
  char cVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  long *plVar14;
  pointer pbVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  mapped_type *this_00;
  long lVar17;
  long *plVar18;
  size_type *psVar19;
  ulong uVar20;
  int retVal;
  string lcovFile;
  string nl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string lineNumber;
  string output;
  string command;
  string actualSourceFile;
  string errors;
  string srcname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string daGlob;
  string sourceFile;
  string dir;
  string fileDir;
  string st2lcovOutputRex3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string lcovExtraFlags;
  string lcovCommand;
  ostringstream cmCTestLog_msg_14;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_20;
  string testingDir;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  int local_9e8;
  int local_9e4;
  int local_9d4;
  string *local_9d0;
  char *local_9c8;
  long local_9c0;
  char local_9b8;
  undefined7 uStack_9b7;
  string local_9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  long *local_970 [2];
  long local_960 [2];
  string local_950;
  long *local_930;
  long local_928;
  long local_920;
  long lStack_918;
  key_type local_910;
  int local_8ec;
  string local_8e8;
  string local_8c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8a8;
  string local_888;
  char *local_868;
  long local_860;
  char local_858;
  undefined7 uStack_857;
  undefined1 *local_848;
  undefined8 local_840;
  undefined1 local_838;
  undefined7 uStack_837;
  string local_828;
  long *local_808 [2];
  long local_7f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  string local_7c8;
  string local_7a8;
  long *local_788;
  long local_780;
  long local_778;
  long lStack_770;
  byte abStack_768 [80];
  ios_base local_718 [408];
  undefined1 local_580 [32];
  byte abStack_560 [80];
  ios_base local_510 [408];
  pointer local_378;
  TotalCoverageMap *local_370;
  pointer local_368;
  undefined1 local_360 [112];
  ios_base local_2f0 [264];
  string local_1e8;
  cmWorkingDirectory local_1c8;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar2 = local_580 + 0x10;
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_7a8,pcVar3,(string *)local_580);
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_7c8,pcVar3,(string *)local_580);
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_7a8);
  if (iVar10 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
    std::ostream::put((char)local_580);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x51f,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    local_9e8 = 0;
    goto LAB_002b15cd;
  }
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"[0-9]+%","");
  local_100.program = (char *)0x0;
  if (local_808[0] != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)local_808[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_580," This is coverage command: ",0x1b);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,local_7a8._M_dataplus._M_p,local_7a8._M_string_length);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x528,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
  if (local_788 != &local_778) {
    operator_delete(local_788,local_778 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
  std::ios_base::~ios_base(local_510);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_580," These are coverage command flags: ",0x23);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x52d,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
  if (local_788 != &local_778) {
    operator_delete(local_788,local_778 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
  std::ios_base::~ios_base(local_510);
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_8a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = FindLCovFiles(this,&local_8a8);
  if (bVar7) {
    if (local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_580," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
      std::ostream::put((char)local_580);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x53a,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_002b14db;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_1e8,(this->super_cmCTestGenericHandler).CTest);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
    local_910._M_string_length = 0;
    local_910.field_2._M_local_buf[0] = '\0';
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_580 + (char)*(undefined8 *)(local_580._0_8_ + -0x18));
    std::ostream::put((char)local_580);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x546,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,"    ",4);
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x547,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    local_9d0 = local_8a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_8a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002b151d:
      local_9e8 = 0;
    }
    else {
      local_370 = &cont->TotalCoverage;
      local_9e8 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,".",1);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x552,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        cmsys::SystemTools::GetFilenamePath(&local_828,local_9d0);
        cmWorkingDirectory::cmWorkingDirectory(&local_1c8,&local_828);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,"\"",&local_7a8);
        plVar14 = (long *)std::__cxx11::string::append((char *)local_360);
        plVar18 = plVar14 + 2;
        if ((long *)*plVar14 == plVar18) {
          local_778 = *plVar18;
          lStack_770 = plVar14[3];
          local_788 = &local_778;
        }
        else {
          local_778 = *plVar18;
          local_788 = (long *)*plVar14;
        }
        local_780 = plVar14[1];
        *plVar14 = (long)plVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_788,(ulong)local_7c8._M_dataplus._M_p);
        psVar19 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar19) {
          local_580._16_8_ = *psVar19;
          local_580._24_8_ = plVar14[3];
          local_580._0_8_ = local_580 + 0x10;
        }
        else {
          local_580._16_8_ = *psVar19;
          local_580._0_8_ = (size_type *)*plVar14;
        }
        local_580._8_8_ = plVar14[1];
        *plVar14 = (long)psVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)local_580);
        local_930 = &local_920;
        plVar18 = plVar14 + 2;
        if ((long *)*plVar14 == plVar18) {
          local_920 = *plVar18;
          lStack_918 = plVar14[3];
        }
        else {
          local_920 = *plVar18;
          local_930 = (long *)*plVar14;
        }
        local_928 = plVar14[1];
        *plVar14 = (long)plVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
          operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
        }
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
          operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_580,"Current coverage dir: ",0x16);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_580,local_828._M_dataplus._M_p,
                             local_828._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x559,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_580,(char *)local_930,local_928);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x55b,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
        if (local_788 != &local_778) {
          operator_delete(local_788,local_778 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
        local_950._M_string_length = 0;
        local_950.field_2._M_local_buf[0] = '\0';
        local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
        local_8e8._M_string_length = 0;
        local_8e8.field_2._M_local_buf[0] = '\0';
        local_9d4 = 0;
        poVar13 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"* Run coverage for: ",0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_828._M_dataplus._M_p,local_828._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        poVar13 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  Command: ",0xb);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_930,local_928);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        bVar7 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,(char *)local_930,
                                    &local_950,&local_8e8,&local_9d4,local_828._M_dataplus._M_p,0.0,
                                    Auto);
        poVar13 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  Output: ",10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_950._M_dataplus._M_p,local_950._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        poVar13 = cont->OFS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  Errors: ",10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_8e8._M_dataplus._M_p,local_8e8._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if (bVar7) {
          if (local_9d4 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"Coverage command returned: ",0x1b);
            poVar13 = (ostream *)std::ostream::operator<<((string *)local_580,local_9d4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," while processing: ",0x13);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(local_9d0->_M_dataplus)._M_p,local_9d0->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x572,(char *)local_788,false);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"Command produced error: ",0x18);
            plVar14 = (long *)std::ostream::operator<<((string *)local_580,cont->Error);
            std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
            std::ostream::put((char)plVar14);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x574,(char *)local_788,false);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,
                     "--------------------------------------------------------------",0x3e);
          cVar5 = (char)(string *)local_580;
          std::ios::widen((char)*(undefined8 *)(local_580._0_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          poVar13 = (ostream *)std::ostream::flush();
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_950._M_dataplus._M_p,local_950._M_string_length);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          poVar13 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"--------------------------------------------------------------",0x3e);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x57d,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_7e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::Split(local_950._M_dataplus._M_p,&local_7e8);
          pbVar15 = local_7e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (pbVar15 ==
                local_7e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
            local_868 = &local_858;
            local_860 = 0;
            local_858 = '\0';
            local_9c8 = &local_9b8;
            local_9c0 = 0;
            local_9b8 = '\0';
            local_378 = pbVar15;
            cmsys::Glob::Glob(&local_188);
            local_188.Recurse = true;
            local_188.RecurseThroughSymlinks = false;
            local_848 = &local_838;
            local_840 = 0;
            local_838 = 0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_988.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmCTest::GetBinaryDir_abi_cxx11_
                      ((string *)local_580,(this->super_cmCTestGenericHandler).CTest);
            std::__cxx11::string::operator=((string *)&local_848,(string *)local_580);
            if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
              operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
            }
            local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
            local_888._M_string_length = 0;
            local_888.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&local_888);
            std::__cxx11::string::append((char *)&local_888);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580,"   looking for LCOV files in: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_580,local_888._M_dataplus._M_p,
                                 local_888._M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x599,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            cmsys::Glob::FindFiles(&local_188,&local_888,(GlobMessages *)0x0);
            pbVar6 = local_988.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            pbVar15 = (pvVar16->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_988,pbVar6,pbVar15,
                       (pvVar16->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            local_9e4 = 0;
            pbVar15 = local_988.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while (bVar7 = pbVar15 !=
                           local_988.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish, bVar7) {
              local_368 = pbVar15;
              std::__cxx11::string::_M_assign((string *)&local_9c8);
              std::ifstream::ifstream((string *)local_580,local_9c8,_S_in);
              if ((abStack_560[*(long *)(local_580._0_8_ + -0x18)] & 5) != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"Cannot open file: ",0x12);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9c8,local_9c0);
                std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,6,
                             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5a5,(char *)local_360._0_8_,false);
                if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                  operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
              }
              local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
              local_8c8._M_string_length = 0;
              local_8c8.field_2._M_local_buf[0] = '\0';
              bVar8 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)local_580,&local_8c8,(bool *)0x0,-1);
              if (bVar8) {
                std::__cxx11::string::substr((ulong)&local_788,(ulong)&local_8c8);
                std::__cxx11::string::operator=((string *)&local_8c8,(string *)&local_788);
                if (local_788 != &local_778) {
                  operator_delete(local_788,local_778 + 1);
                }
                std::__cxx11::string::_M_assign((string *)&local_868);
                std::__cxx11::string::_M_assign((string *)&local_910);
                for (pbVar15 = local_988.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar15 !=
                    local_988.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_788,"Found LCOV File: ",0x11);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_788,(pbVar15->_M_dataplus)._M_p,
                                       pbVar15->_M_string_length);
                  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                  std::ostream::put((char)poVar13);
                  std::ostream::flush();
                  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5bb,(char *)local_360._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                  std::ios_base::~ios_base(local_718);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"SourceFile: ",0xc);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_868,local_860);
                std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5bf,(char *)local_360._0_8_,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                  operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"lCovFile: ",10);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9c8,local_9c0);
                std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5c1,(char *)local_360._0_8_,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                  operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
                if ((local_9c0 != 0) && ((char *)local_910._M_string_length != (char *)0x0)) {
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                            ::operator[](local_370,&local_910);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_788,"   in lcovFile: ",0x10);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_788,local_9c8,local_9c0);
                  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                  std::ostream::put((char)poVar13);
                  std::ostream::flush();
                  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5ca,(char *)local_360._0_8_,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                  std::ios_base::~ios_base(local_718);
                  std::ifstream::ifstream((ostringstream *)&local_788,local_9c8,_S_in);
                  if ((abStack_768[local_788[-3]] & 5) == 0) {
                    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
                    local_9a8._M_string_length = 0;
                    local_9a8.field_2._M_local_buf[0] = '\0';
                    cmsys::SystemTools::GetLineFromStream
                              ((istream *)&local_788,&local_9a8,(bool *)0x0,-1);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_360,"File is ready, start reading.",0x1d);
                    std::ios::widen((char)*(undefined8 *)(local_360._0_8_ + -0x18) + (char)local_360
                                   );
                    std::ostream::put((char)local_360);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5d8,(char *)local_970[0],
                                 (this->super_cmCTestGenericHandler).Quiet);
                    if (local_970[0] != local_960) {
                      operator_delete(local_970[0],local_960[0] + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                    std::ios_base::~ios_base(local_2f0);
                    while (bVar9 = cmsys::SystemTools::GetLineFromStream
                                             ((istream *)&local_788,&local_9a8,(bool *)0x0,-1),
                          bVar9) {
                      if (0xb < local_9a8._M_string_length) {
                        std::__cxx11::string::substr((ulong)local_360,(ulong)&local_9a8);
                        iVar10 = atoi((char *)local_360._0_8_);
                        std::__cxx11::string::substr((ulong)local_970,(ulong)&local_9a8);
                        iVar11 = atoi((char *)local_970[0]);
                        if (0 < iVar11) {
                          uVar20 = (ulong)(iVar11 + -1);
                          while( true ) {
                            piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start;
                            __position._M_current =
                                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (uVar20 < (ulong)((long)__position._M_current - (long)piVar4 >> 2))
                            break;
                            local_8ec = -1;
                            if (__position._M_current ==
                                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                        (this_00,__position,&local_8ec);
                            }
                            else {
                              *__position._M_current = -1;
                              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish = __position._M_current + 1;
                            }
                          }
                          if ((piVar4[uVar20] < 0) &&
                             ((0 < iVar10 ||
                              (lVar17 = std::__cxx11::string::find((char)local_360,0x23),
                              lVar17 != -1)))) {
                            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar20] = 0;
                          }
                          piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar20;
                          *piVar1 = *piVar1 + iVar10;
                        }
                        if (local_970[0] != local_960) {
                          operator_delete(local_970[0],local_960[0] + 1);
                        }
                        if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                          operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                        }
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                      operator_delete(local_9a8._M_dataplus._M_p,
                                      CONCAT71(local_9a8.field_2._M_allocated_capacity._1_7_,
                                               local_9a8.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_360,"Cannot open file: ",0x12);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_360,local_9c8,local_9c0);
                    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                    std::ostream::put((char)poVar13);
                    std::ostream::flush();
                    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5cf,local_9a8._M_dataplus._M_p,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
                      operator_delete(local_9a8._M_dataplus._M_p,
                                      CONCAT71(local_9a8.field_2._M_allocated_capacity._1_7_,
                                               local_9a8.field_2._M_local_buf[0]) + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                    std::ios_base::~ios_base(local_2f0);
                  }
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_910,0,(char *)local_910._M_string_length,0x674b0e);
                  std::ifstream::~ifstream((ostringstream *)&local_788);
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_788,"Error while parsing lcov file \'",0x1f);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_788,local_9c8,local_9c0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\':",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13," No source file name found!",0x1b);
                std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,6,
                             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5ae,(char *)local_360._0_8_,false);
                if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                  operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
                std::ios_base::~ios_base(local_718);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
                operator_delete(local_8c8._M_dataplus._M_p,
                                CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                                         local_8c8.field_2._M_local_buf[0]) + 1);
              }
              std::ifstream::~ifstream((string *)local_580);
              if (!bVar8) {
                local_9e4 = 1;
                break;
              }
              pbVar15 = local_368 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_888._M_dataplus._M_p != &local_888.field_2) {
              operator_delete(local_888._M_dataplus._M_p,
                              CONCAT71(local_888.field_2._M_allocated_capacity._1_7_,
                                       local_888.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_988);
            if (local_848 != &local_838) {
              operator_delete(local_848,CONCAT71(uStack_837,local_838) + 1);
            }
            cmsys::Glob::~Glob(&local_188);
            if (local_9c8 != &local_9b8) {
              operator_delete(local_9c8,CONCAT71(uStack_9b7,local_9b8) + 1);
            }
            if (local_868 != &local_858) {
              operator_delete(local_868,CONCAT71(uStack_857,local_858) + 1);
            }
            if (bVar7) goto LAB_002b12fa;
            pbVar15 = local_378 + 1;
          }
          iVar10 = local_9e8 * -0x3d70a3d7;
          local_9e8 = local_9e8 + 1;
          uVar12 = iVar10 + 0xc7ae1479;
          local_9e4 = 0;
          if ((uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f) < 0x51eb851) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_580," processed: ",0xc);
            poVar13 = (ostream *)std::ostream::operator<<((string *)local_580,local_9e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," out of ",8);
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x60d,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_580,"    ",4);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x60e,(char *)local_788,(this->super_cmCTestGenericHandler).Quiet);
            if (local_788 != &local_778) {
              operator_delete(local_788,local_778 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            std::ios_base::~ios_base(local_510);
          }
LAB_002b12fa:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_7e8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,"Problem running coverage on file: ",0x22);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_580,(local_9d0->_M_dataplus)._M_p,
                               local_9d0->_M_string_length);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x56a,(char *)local_788,false);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_580,"Command produced error: ",0x18);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_580,local_8e8._M_dataplus._M_p,
                               local_8e8._M_string_length);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x56c,(char *)local_788,false);
          if (local_788 != &local_778) {
            operator_delete(local_788,local_778 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
          std::ios_base::~ios_base(local_510);
          cont->Error = cont->Error + 1;
          local_9e4 = 0x12;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
          operator_delete(local_8e8._M_dataplus._M_p,
                          CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                                   local_8e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._M_dataplus._M_p != &local_950.field_2) {
          operator_delete(local_950._M_dataplus._M_p,
                          CONCAT71(local_950.field_2._M_allocated_capacity._1_7_,
                                   local_950.field_2._M_local_buf[0]) + 1);
        }
        if (local_930 != &local_920) {
          operator_delete(local_930,local_920 + 1);
        }
        cmWorkingDirectory::~cmWorkingDirectory(&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
        }
        if ((local_9e4 != 0x12) && (local_9e4 != 0)) goto LAB_002b151d;
        local_9d0 = local_9d0 + 1;
      } while (local_9d0 !=
               local_8a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p,
                      CONCAT71(local_910.field_2._M_allocated_capacity._1_7_,
                               local_910.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_580,"Error while finding LCov files.\n",0x20);
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x532,(char *)local_788,false);
LAB_002b14db:
    if (local_788 != &local_778) {
      operator_delete(local_788,local_778 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    local_9e8 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8a8);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
LAB_002b15cd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  return local_9e8;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }
  std::vector<std::string>::iterator it;

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (it = files.begin(); it != files.end(); ++it) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmWorkingDirectory workdir(fileDir);
    std::string command = "\"" + lcovCommand + "\" " + lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res =
      this->CTest->RunCommand(command.c_str(), &output, &errors, &retVal,
                              fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
                   << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for (line = lines.begin(); line != lines.end(); ++line) {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for (std::vector<std::string>::iterator a = lcovFiles.begin();
           a != lcovFiles.end(); ++a) {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::vector<std::string>::iterator t = lcovFiles.begin();
             t != lcovFiles.end(); ++t) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << *t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile = "";
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}